

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictVectorizer.pb.cc
# Opt level: O2

DictVectorizer * __thiscall
CoreML::Specification::DictVectorizer::New(DictVectorizer *this,Arena *arena)

{
  DictVectorizer *this_00;
  
  this_00 = (DictVectorizer *)operator_new(0x20);
  DictVectorizer(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::DictVectorizer>(arena,this_00);
  }
  return this_00;
}

Assistant:

DictVectorizer* DictVectorizer::New(::google::protobuf::Arena* arena) const {
  DictVectorizer* n = new DictVectorizer;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}